

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_api.c
# Opt level: O0

MPP_RET mpg4d_parse(void *dec,HalDecTask *task)

{
  MPP_RET MVar1;
  Mpg4dCtx *p;
  MPP_RET ret;
  HalDecTask *task_local;
  void *dec_local;
  
  if ((dec == (void *)0x0) || (task == (HalDecTask *)0x0)) {
    _mpp_log_l(2,"mpg4d_api","found NULL intput dec %p task %p\n","mpg4d_parse",dec,task);
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = mpp_mpg4_parser_decode(*(Mpg4dParser *)((long)dec + 0x48),task->input_packet);
    if (MVar1 == MPP_OK) {
      mpp_mpg4_parser_setup_syntax(*(Mpg4dParser *)((long)dec + 0x48),&task->syntax);
      mpp_mpg4_parser_setup_hal_output(*(Mpg4dParser *)((long)dec + 0x48),&task->output);
      mpp_mpg4_parser_setup_refer(*(Mpg4dParser *)((long)dec + 0x48),task->refer,0x11);
      mpp_mpg4_parser_update_dpb(*(Mpg4dParser *)((long)dec + 0x48));
      if (*(int *)((long)dec + 0x38) == 0) {
        *(int *)((long)dec + 0x3c) = *(int *)((long)dec + 0x3c) + 1;
        dec_local._4_4_ = MPP_OK;
      }
      else {
        (task->flags).val = (task->flags).val & 0xfffffffffffffffe | 1;
        mpg4d_flush(dec);
        dec_local._4_4_ = MPP_OK;
      }
    }
    else {
      task->valid = 0;
      task->output = -1;
      mpp_packet_set_length(task->input_packet,0);
      dec_local._4_4_ = MPP_NOK;
    }
  }
  return dec_local._4_4_;
}

Assistant:

static MPP_RET mpg4d_parse(void *dec, HalDecTask *task)
{
    MPP_RET ret;
    Mpg4dCtx *p;

    if (NULL == dec || NULL == task) {
        mpp_err_f("found NULL intput dec %p task %p\n", dec, task);
        return MPP_ERR_NULL_PTR;
    }
    p = (Mpg4dCtx *)dec;
    ret = mpp_mpg4_parser_decode(p->parser, task->input_packet);
    if (ret) {
        // found error on decoding drop this task and clear remaining length
        task->valid  = 0;
        task->output = -1;
        mpp_packet_set_length(task->input_packet, 0);

        return MPP_NOK;
    }

    mpp_mpg4_parser_setup_syntax(p->parser, &task->syntax);
    mpp_mpg4_parser_setup_hal_output(p->parser, &task->output);
    mpp_mpg4_parser_setup_refer(p->parser, task->refer, MAX_DEC_REF_NUM);
    mpp_mpg4_parser_update_dpb(p->parser);

    if (p->got_eos) {
        task->flags.eos = 1;
        mpg4d_flush(dec);
        return MPP_OK;
    }

    p->frame_count++;

    return MPP_OK;
}